

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ismsnoop.cpp
# Opt level: O2

DataType ismsnoop::find_data(ifstream *ifs,int byte_offset,
                            shared_ptr<ismsnoop::VersionHandler> *handler)

{
  pointer __src;
  element_type *peVar1;
  int iVar2;
  DataType DVar3;
  int iVar4;
  bool bVar5;
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer;
  value_type_conflict1 local_34 [2];
  uint32_t x;
  
  std::istream::seekg((long)ifs,byte_offset);
  iVar2 = std::istream::tellg();
  buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  iVar4 = 0x80;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    std::istream::read((char *)ifs,(long)local_34);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,local_34);
  }
  do {
    if ((ulong)((long)buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start - (long)auStack_58) < 0x3d) {
      DVar3 = None;
LAB_00105fd3:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58);
      return DVar3;
    }
    local_34[0] = 0;
    peVar1 = (handler->super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar4 = (*peVar1->_vptr_VersionHandler[1])(peVar1,auStack_58,local_34);
    if ((char)iVar4 != '\0') {
      std::istream::seekg((long)ifs,
                          auStack_58._0_4_ +
                          (iVar2 - (int)buffer.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) + local_34[0] * 4
                          + 0x200);
      DVar3 = BackgroundImage;
      goto LAB_00105fd3;
    }
    peVar1 = (handler->super___shared_ptr<ismsnoop::VersionHandler,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar4 = (*peVar1->_vptr_VersionHandler[2])(peVar1,auStack_58,local_34);
    if ((char)iVar4 != '\0') {
      std::istream::seekg((long)ifs,
                          auStack_58._0_4_ +
                          (iVar2 - (int)buffer.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) + local_34[0] * 4
                          + 0x200);
      DVar3 = InfoText;
      goto LAB_00105fd3;
    }
    __src = (pointer)((long)auStack_58 + 4);
    if (__src != buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
      memmove((void *)auStack_58,__src,
              (long)buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start - (long)__src);
    }
    buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + -1;
  } while( true );
}

Assistant:

static DataType find_data(std::ifstream & ifs, int byte_offset, std::shared_ptr<VersionHandler> handler)
{
	ifs.seekg(byte_offset, std::ios::cur);

	auto start = ifs.tellg();

	std::vector<uint32_t> buffer;

	for (int i = 0; i < 128; i++)
	{
		uint32_t x;
		ifs.read((char*)(&x), 4);
		buffer.push_back(x);
	}

	while (buffer.size() > 15)
	{
		int next = 0;

		if (handler->looks_like_a_background_image(buffer, &next))
		{
			ifs.seekg(start + (std::streampos((next * 4) + ((128 - buffer.size()) * 4))), std::ios::beg);
			return DataType::BackgroundImage;
		}

		if (handler->looks_like_the_info_text(buffer, &next))
		{
			ifs.seekg(start + (std::streampos((next * 4) + ((128 - buffer.size()) * 4))), std::ios::beg);
			return DataType::InfoText;
		}

		buffer.erase(buffer.begin());
	}

	return DataType::None;
}